

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::
ApplyVar<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::ApplyVar(ApplyVar<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
           *this,ApplyFunc *func,VariableP<tcu::Matrix<float,_2,_4>_> *arg0,
          VariableP<deqp::gls::BuiltinPrecisionTests::Void> *arg1,
          VariableP<deqp::gls::BuiltinPrecisionTests::Void> *arg2,
          VariableP<deqp::gls::BuiltinPrecisionTests::Void> *arg3)

{
  deInt32 *pdVar1;
  ExprP<deqp::gls::BuiltinPrecisionTests::Void> local_68;
  ExprP<deqp::gls::BuiltinPrecisionTests::Void> local_58;
  ExprP<deqp::gls::BuiltinPrecisionTests::Void> local_48;
  ExprP<tcu::Matrix<float,_2,_4>_> local_38;
  
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)&local_38);
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)&local_48);
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)&local_58);
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)&local_68);
  (this->
  super_Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ).super_Expr<tcu::Matrix<float,_4,_2>_>.super_ExprBase._vptr_ExprBase =
       (_func_int **)&PTR__Apply_00b45dc0;
  (this->
  super_Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ).m_func = func;
  Tuple4<deqp::gls::BuiltinPrecisionTests::ExprP<tcu::Matrix<float,_2,_4>_>,_deqp::gls::BuiltinPrecisionTests::ExprP<deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::ExprP<deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::ExprP<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Tuple4(&(this->
            super_Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            ).m_args,&local_38,&local_48,&local_58,&local_68);
  if (local_68.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
      super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
      .m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_68.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_68.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
      super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
      .m_ptr = (Expr<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
      (*(local_68.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
         super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
        .m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_68.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_68.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
        super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
        .m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_68.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
         super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
        .m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  if (local_58.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
      super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
      .m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_58.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_58.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
      super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
      .m_ptr = (Expr<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
      (*(local_58.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
         super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
        .m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_58.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_58.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
        super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
        .m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_58.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
         super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
        .m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  if (local_48.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
      super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
      .m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_48.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_48.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
      super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
      .m_ptr = (Expr<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
      (*(local_48.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
         super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
        .m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_48.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_48.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
        super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
        .m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_48.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
         super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
        .m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  if (local_38.super_ContainerExprPBase<tcu::Matrix<float,_2,_4>_>.
      super_ExprPBase<tcu::Matrix<float,_2,_4>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_4>_>_>.
      m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_38.super_ContainerExprPBase<tcu::Matrix<float,_2,_4>_>.
               super_ExprPBase<tcu::Matrix<float,_2,_4>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_4>_>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_38.super_ContainerExprPBase<tcu::Matrix<float,_2,_4>_>.
      super_ExprPBase<tcu::Matrix<float,_2,_4>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_4>_>_>.
      m_ptr = (Expr<tcu::Matrix<float,_2,_4>_> *)0x0;
      (*(local_38.super_ContainerExprPBase<tcu::Matrix<float,_2,_4>_>.
         super_ExprPBase<tcu::Matrix<float,_2,_4>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_4>_>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_38.super_ContainerExprPBase<tcu::Matrix<float,_2,_4>_>.
               super_ExprPBase<tcu::Matrix<float,_2,_4>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_4>_>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_38.super_ContainerExprPBase<tcu::Matrix<float,_2,_4>_>.
        super_ExprPBase<tcu::Matrix<float,_2,_4>_>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_4>_>_>.
        m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_38.super_ContainerExprPBase<tcu::Matrix<float,_2,_4>_>.
         super_ExprPBase<tcu::Matrix<float,_2,_4>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_4>_>_>.
        m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  (this->
  super_Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ).super_Expr<tcu::Matrix<float,_4,_2>_>.super_ExprBase._vptr_ExprBase =
       (_func_int **)&PTR__Apply_00b45d58;
  return;
}

Assistant:

ApplyVar	(const ApplyFunc&			func,
									 const VariableP<Arg0>&		arg0,
									 const VariableP<Arg1>&		arg1,
									 const VariableP<Arg2>&		arg2,
									 const VariableP<Arg3>&		arg3)
							: Apply<Sig> (func, arg0, arg1, arg2, arg3) {}